

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::subject::SubjectFactory::FX::FXBase::SetQuantity
          (FXBase *this,string *key,double qty)

{
  FX *pFVar1;
  InvalidSubjectException *this_00;
  string qty_string;
  string local_1c8;
  stringstream ss;
  long local_198;
  undefined8 local_190 [2];
  uint auStack_180 [88];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_190 + *(long *)(local_198 + -0x18)) = 2;
  if (0.0 < qty) {
    std::ostream::_M_insert<double>(qty);
    std::__cxx11::stringbuf::str();
    pFVar1 = this->outer_class_;
    std::__cxx11::stringbuf::str();
    SubjectBuilder::SetComponent
              (&(pFVar1->super_MandatoryFieldsSubjectCreator).subject_builder_,key,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&qty_string);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return;
  }
  std::operator<<((ostream *)&local_198,"dealt quantity must be a positive value: ");
  std::ostream::_M_insert<double>(qty);
  this_00 = (InvalidSubjectException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  InvalidSubjectException::InvalidSubjectException(this_00,&qty_string);
  __cxa_throw(this_00,&InvalidSubjectException::typeinfo,
              InvalidSubjectException::~InvalidSubjectException);
}

Assistant:

void SubjectFactory::FX::FXBase::SetQuantity(const std::string& key, double qty)
{
    std::stringstream ss;

    if (qty <= 0)
    {
        ss << std::fixed << std::setprecision(2) << "dealt quantity must be a positive value: " << qty;
        throw InvalidSubjectException(ss.str());
    }

    ss << std::fixed << std::setprecision(2) << qty;

    std::string qty_string = ss.str();

    outer_class_.subject_builder_.SetComponent(key, ss.str());
}